

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O0

int __thiscall OpenMD::ElementsTable::GetMaxBonds(ElementsTable *this,int atomicnum)

{
  int iVar1;
  size_type sVar2;
  reference ppEVar3;
  int in_ESI;
  byte *in_RDI;
  ElementsTable *in_stack_000080d0;
  
  if ((*in_RDI & 1) == 0) {
    Init(in_stack_000080d0);
  }
  if ((-1 < in_ESI) &&
     (sVar2 = std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::size
                        ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                         (in_RDI + 0x88)), in_ESI < (int)sVar2)) {
    ppEVar3 = std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::operator[]
                        ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                         (in_RDI + 0x88),(long)in_ESI);
    iVar1 = Element::GetMaxBonds(*ppEVar3);
    return iVar1;
  }
  return 0;
}

Assistant:

int ElementsTable::GetMaxBonds(int atomicnum) {
    if (!init_) Init();

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size()))
      return (0);

    return (elements_[atomicnum]->GetMaxBonds());
  }